

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

uint xmlXPathNodeValHash(xmlNodePtr node)

{
  byte *pbVar1;
  uint local_34;
  _xmlNode *p_Stack_30;
  uint ret;
  xmlNodePtr tmp;
  xmlChar *string;
  xmlNodePtr pxStack_18;
  int len;
  xmlNodePtr node_local;
  
  string._4_4_ = 2;
  local_34 = 0;
  if (node == (xmlNodePtr)0x0) {
    return 0;
  }
  pxStack_18 = node;
  if (node->type == XML_DOCUMENT_NODE) {
    pxStack_18 = xmlDocGetRootElement((xmlDoc *)node);
    if (pxStack_18 == (xmlNodePtr)0x0) {
      pxStack_18 = node->children;
    }
    if (pxStack_18 == (xmlNodePtr)0x0) {
      return 0;
    }
  }
  switch(pxStack_18->type) {
  case XML_ELEMENT_NODE:
    p_Stack_30 = pxStack_18->children;
    goto LAB_00258572;
  case XML_ATTRIBUTE_NODE:
    p_Stack_30 = pxStack_18->children;
LAB_00258572:
    if (p_Stack_30 != (xmlNodePtr)0x0) {
      if (p_Stack_30->type == XML_TEXT_NODE || p_Stack_30->type == XML_CDATA_SECTION_NODE) {
        tmp = (xmlNodePtr)p_Stack_30->content;
      }
      else {
        tmp = (xmlNodePtr)0x0;
      }
      if ((tmp != (xmlNodePtr)0x0) && (*(char *)&tmp->_private != '\0')) {
        if (string._4_4_ == 1) {
          return local_34 + (uint)*(byte *)&tmp->_private * 0x100;
        }
        if (*(char *)((long)&tmp->_private + 1) != '\0') {
          return (uint)*(byte *)&tmp->_private + (uint)*(byte *)((long)&tmp->_private + 1) * 0x100;
        }
        string._4_4_ = 1;
        local_34 = (uint)*(byte *)&tmp->_private;
      }
      if (((p_Stack_30->children == (_xmlNode *)0x0) || (p_Stack_30->type == XML_DTD_NODE)) ||
         (p_Stack_30->children->type == XML_ENTITY_DECL)) {
        if (p_Stack_30 == pxStack_18) goto LAB_002586c2;
        if (p_Stack_30->next == (_xmlNode *)0x0) {
          do {
            p_Stack_30 = p_Stack_30->parent;
            if (p_Stack_30 == (_xmlNode *)0x0) break;
            if (p_Stack_30 == pxStack_18) {
              p_Stack_30 = (xmlNodePtr)0x0;
              break;
            }
            if (p_Stack_30->next != (_xmlNode *)0x0) {
              p_Stack_30 = p_Stack_30->next;
              break;
            }
          } while (p_Stack_30 != (_xmlNode *)0x0);
        }
        else {
          p_Stack_30 = p_Stack_30->next;
        }
      }
      else {
        p_Stack_30 = p_Stack_30->children;
      }
      goto LAB_00258572;
    }
LAB_002586c2:
    node_local._4_4_ = local_34;
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    pbVar1 = pxStack_18->content;
    if (pbVar1 == (byte *)0x0) {
      node_local._4_4_ = 0;
    }
    else if (*pbVar1 == 0) {
      node_local._4_4_ = 0;
    }
    else {
      node_local._4_4_ = (uint)*pbVar1 + (uint)pbVar1[1] * 0x100;
    }
    break;
  default:
    node_local._4_4_ = 0;
    break;
  case XML_NAMESPACE_DECL:
    pbVar1 = pxStack_18->name;
    if (pbVar1 == (byte *)0x0) {
      node_local._4_4_ = 0;
    }
    else if (*pbVar1 == 0) {
      node_local._4_4_ = 0;
    }
    else {
      node_local._4_4_ = (uint)*pbVar1 + (uint)pbVar1[1] * 0x100;
    }
  }
  return node_local._4_4_;
}

Assistant:

static unsigned int
xmlXPathNodeValHash(xmlNodePtr node) {
    int len = 2;
    const xmlChar * string = NULL;
    xmlNodePtr tmp = NULL;
    unsigned int ret = 0;

    if (node == NULL)
	return(0);

    if (node->type == XML_DOCUMENT_NODE) {
	tmp = xmlDocGetRootElement((xmlDocPtr) node);
	if (tmp == NULL)
	    node = node->children;
	else
	    node = tmp;

	if (node == NULL)
	    return(0);
    }

    switch (node->type) {
	case XML_COMMENT_NODE:
	case XML_PI_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_TEXT_NODE:
	    string = node->content;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_NAMESPACE_DECL:
	    string = ((xmlNsPtr)node)->href;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_ATTRIBUTE_NODE:
	    tmp = ((xmlAttrPtr) node)->children;
	    break;
	case XML_ELEMENT_NODE:
	    tmp = node->children;
	    break;
	default:
	    return(0);
    }
    while (tmp != NULL) {
	switch (tmp->type) {
	    case XML_CDATA_SECTION_NODE:
	    case XML_TEXT_NODE:
		string = tmp->content;
		break;
	    default:
                string = NULL;
		break;
	}
	if ((string != NULL) && (string[0] != 0)) {
	    if (len == 1) {
		return(ret + (string[0] << 8));
	    }
	    if (string[1] == 0) {
		len = 1;
		ret = string[0];
	    } else {
		return(string[0] + (string[1] << 8));
	    }
	}
	/*
	 * Skip to next node
	 */
	if ((tmp->children != NULL) && (tmp->type != XML_DTD_NODE)) {
	    if (tmp->children->type != XML_ENTITY_DECL) {
		tmp = tmp->children;
		continue;
	    }
	}
	if (tmp == node)
	    break;

	if (tmp->next != NULL) {
	    tmp = tmp->next;
	    continue;
	}

	do {
	    tmp = tmp->parent;
	    if (tmp == NULL)
		break;
	    if (tmp == node) {
		tmp = NULL;
		break;
	    }
	    if (tmp->next != NULL) {
		tmp = tmp->next;
		break;
	    }
	} while (tmp != NULL);
    }
    return(ret);
}